

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-similarities.cc
# Opt level: O2

void __thiscall
dynet::DotProduct::backward_dev_impl<dynet::Device_CPU>
          (DotProduct *this,Device_CPU *dev,
          vector<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_> *xs,Tensor *fx,
          Tensor *dEdf,uint i,Tensor *dEdxi)

{
  uint uVar1;
  pointer ppTVar2;
  array<int,_1UL> aVar3;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> TVar4;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_108;
  StoragePointerType local_f0;
  StoragePointerType pfStack_e8;
  _Type local_e0;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_d0;
  StoragePointerType local_c0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_b8;
  TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer> local_a0;
  TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> local_90;
  undefined1 local_78 [32];
  StoragePointerType pfStack_58;
  _Type local_50;
  array<int,_2UL> local_48;
  array<int,_2UL> local_40;
  array<int,_1UL> local_38;
  
  uVar1 = (fx->d).bd;
  aVar3._M_elems[0] =
       (_Type)Dim::batch_size(&(xs->
                               super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                               )._M_impl.super__Vector_impl_data._M_start[i]->d);
  if (uVar1 == 1) {
    TVar4 = Tensor::tvec((xs->
                         super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
                         )._M_impl.super__Vector_impl_data._M_start[1 - i]);
    local_78._16_16_ = (undefined1  [16])Tensor::tvec(dEdf);
    pfStack_58 = (StoragePointerType)CONCAT44(pfStack_58._4_4_,aVar3._M_elems[0]);
    local_78._0_16_ = (undefined1  [16])TVar4;
    local_d0 = Tensor::tvec(dEdxi);
    local_108.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_d0;
    local_108.m_data = (StoragePointerType)dev->edevice;
    Eigen::
    TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
    ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                  *)&local_108,
                 (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_1UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_1,_0,_long>,_0,_Eigen::MakePointer>_>_>
                  *)local_78);
  }
  else {
    ppTVar2 = (xs->super__Vector_base<const_dynet::Tensor_*,_std::allocator<const_dynet::Tensor_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    if (((*ppTVar2)->d).bd == (ppTVar2[1]->d).bd) {
      Tensor::tbvec(&local_108,ppTVar2[1 - i]);
      Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_d0,
                    dEdf);
      local_50 = (_Type)local_c0;
      pfStack_58 = (StoragePointerType)local_d0.m_dimensions.super_array<long,_1>._M_elems[0];
      local_48._M_elems = (_Type)((ulong)(uint)aVar3._M_elems[0] | 0x100000000);
      local_78._24_8_ = local_d0.m_data;
      local_78._16_8_ = local_108.m_dimensions.super_array<long,_2>._M_elems[1];
      Tensor::tbvec(&local_90,dEdxi);
      local_b8.m_data = (StoragePointerType)dev->edevice;
      local_b8.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_90;
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                    *)&local_b8,
                   (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
                    *)local_78);
    }
    else if ((dEdxi->d).bd == 1) {
      Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_d0,
                    ppTVar2[1 - i]);
      Tensor::tbvec(&local_90,dEdf);
      local_f0 = local_90.m_data;
      pfStack_e8 = (StoragePointerType)local_90.m_dimensions.super_array<long,_2>._M_elems[0];
      local_e0[0] = (undefined4)local_90.m_dimensions.super_array<long,_2>._M_elems[1];
      local_e0[1] = local_90.m_dimensions.super_array<long,_2>._M_elems[1]._4_4_;
      local_48._M_elems = (_Type)((ulong)(uint)aVar3._M_elems[0] | 0x100000000);
      local_108.m_dimensions.super_array<long,_2>._M_elems[1] = (long)local_c0;
      local_108.m_data = local_d0.m_data;
      local_108.m_dimensions.super_array<long,_2>._M_elems[0] =
           (long)local_d0.m_dimensions.super_array<long,_1>._M_elems[0];
      pfStack_58 = (StoragePointerType)local_90.m_dimensions.super_array<long,_2>._M_elems[0];
      local_50[0] = (undefined4)local_90.m_dimensions.super_array<long,_2>._M_elems[1];
      local_50[1] = local_90.m_dimensions.super_array<long,_2>._M_elems[1]._4_4_;
      local_38._M_elems[0] = (_Type)1;
      local_a0 = Tensor::tvec(dEdxi);
      local_b8.m_dimensions.super_array<long,_2>._M_elems[0] = (long)&local_a0;
      local_b8.m_data = (StoragePointerType)dev->edevice;
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,1,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                    *)&local_b8,
                   (TensorReductionOp<Eigen::internal::SumReducer<float>,_const_std::array<int,_1UL>,_const_Eigen::TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>,_Eigen::MakePointer>
                    *)local_78);
    }
    else {
      uVar1 = (fx->d).bd;
      Tensor::tbvec((TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer> *)&local_d0,
                    ppTVar2[1 - i]);
      local_108.m_dimensions.super_array<long,_2>._M_elems[1] = (long)local_c0;
      local_108.m_data = local_d0.m_data;
      local_108.m_dimensions.super_array<long,_2>._M_elems[0] =
           (long)local_d0.m_dimensions.super_array<long,_1>._M_elems[0];
      Tensor::tbvec(&local_90,dEdf);
      local_48._M_elems[0] = (undefined4)local_90.m_dimensions.super_array<long,_2>._M_elems[1];
      local_48._M_elems[1] = local_90.m_dimensions.super_array<long,_2>._M_elems[1]._4_4_;
      pfStack_58 = local_90.m_data;
      local_50[0] = (undefined4)local_90.m_dimensions.super_array<long,_2>._M_elems[0];
      local_50[1] = local_90.m_dimensions.super_array<long,_2>._M_elems[0]._4_4_;
      local_40._M_elems = (_Type)((ulong)(uint)aVar3._M_elems[0] | 0x100000000);
      local_78._8_8_ = local_108.m_dimensions.super_array<long,_2>._M_elems[0];
      local_78._0_8_ = local_108.m_data;
      local_78._24_8_ = ((ulong)uVar1 << 0x20) + 1;
      local_78._16_8_ = local_108.m_dimensions.super_array<long,_2>._M_elems[1];
      Tensor::tbvec(&local_b8,dEdxi);
      local_a0.m_dimensions.super_array<long,_1>._M_elems[0] =
           (array<long,_1>)(array<long,_1>)&local_b8;
      local_a0.m_data = (StoragePointerType)dev->edevice;
      Eigen::
      TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
      ::operator+=((TensorDevice<Eigen::TensorMap<Eigen::Tensor<float,2,0,long>,0,Eigen::MakePointer>,Eigen::DefaultDevice>
                    *)&local_a0,
                   (TensorCwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>,_const_Eigen::TensorBroadcastingOp<const_std::array<int,_2UL>,_const_Eigen::TensorMap<Eigen::Tensor<float,_2,_0,_long>,_0,_Eigen::MakePointer>_>_>
                    *)local_78);
    }
  }
  return;
}

Assistant:

void DotProduct::backward_dev_impl(const MyDevice & dev,
                             const vector<const Tensor*>& xs,
                             const Tensor& fx,
                             const Tensor& dEdf,
                             unsigned i,
                             Tensor& dEdxi) const {
  if(fx.d.bd == 1) {
    Eigen::array<int, 1> bcast; bcast[0] = xs[i]->d.batch_size();
    dEdxi.tvec().device(*dev.edevice) += xs[1-i]->tvec() * dEdf.tvec().broadcast(bcast);
  } else {
    Eigen::array<int, 2> bcast; bcast[0] =xs[i]->d.batch_size(); bcast[1] = 1;
    if(xs[0]->d.bd == xs[1]->d.bd) {
      dEdxi.tbvec().device(*dev.edevice) += xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast);
    } else if(dEdxi.d.bd == 1) {
      Eigen::array<int, 1> red_axis; red_axis[0] = 1;
      dEdxi.tvec().device(*dev.edevice) += (xs[1-i]->tbvec() * dEdf.tbvec().broadcast(bcast)).sum(red_axis);
    } else {
      Eigen::array<int, 2> batchcast; batchcast[0] = 1; batchcast[1] = fx.d.bd;
      dEdxi.tbvec().device(*dev.edevice) += (xs[1-i]->tbvec().broadcast(batchcast) * dEdf.tbvec().broadcast(bcast));
    }
  }
}